

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O0

void cjson_set_number_value_should_set_numbers(void)

{
  long lVar1;
  long in_FS_OFFSET;
  undefined1 auStack_58 [8];
  cJSON number [1];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  number[0].valueint = 0;
  number[0]._44_4_ = 0;
  number[0].valuedouble = 0.0;
  number[0].type = 0;
  number[0]._28_4_ = 0;
  number[0].valuestring = (char *)0x0;
  number[0].prev = (cJSON *)0x0;
  auStack_58 = (undefined1  [8])0x0;
  number[0].next = (cJSON *)0x0;
  number[0].child = (cJSON *)0x8;
  cJSON_SetNumberHelper((cJSON *)auStack_58,1.5);
  UnityAssertEqualNumber
            (1,(long)(int)number[0].valuestring,(char *)0x0,0xe3,UNITY_DISPLAY_STYLE_INT);
  UnityAssertDoublesWithin(1.5e-12,1.5,(UNITY_DOUBLE)number[0]._40_8_,(char *)0x0,0xe4);
  cJSON_SetNumberHelper((cJSON *)auStack_58,-1.5);
  UnityAssertEqualNumber
            (-1,(long)(int)number[0].valuestring,(char *)0x0,0xe7,UNITY_DISPLAY_STYLE_INT);
  UnityAssertDoublesWithin(-1.5e-12,-1.5,(UNITY_DOUBLE)number[0]._40_8_,(char *)0x0,0xe8);
  cJSON_SetNumberHelper((cJSON *)auStack_58,2147483648.0);
  UnityAssertEqualNumber
            (0x7fffffff,(long)(int)number[0].valuestring,(char *)0x0,0xeb,UNITY_DISPLAY_STYLE_INT);
  UnityAssertDoublesWithin
            (0.002147483648,2147483648.0,(UNITY_DOUBLE)number[0]._40_8_,(char *)0x0,0xec);
  cJSON_SetNumberHelper((cJSON *)auStack_58,-2147483649.0);
  UnityAssertEqualNumber
            (-0x80000000,(long)(int)number[0].valuestring,(char *)0x0,0xef,UNITY_DISPLAY_STYLE_INT);
  UnityAssertDoublesWithin
            (-0.002147483649,-2147483649.0,(UNITY_DOUBLE)number[0]._40_8_,(char *)0x0,0xf0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void cjson_set_number_value_should_set_numbers(void)
{
    cJSON number[1] = {{NULL, NULL, NULL, cJSON_Number, NULL, 0, 0, NULL}};

    cJSON_SetNumberValue(number, 1.5);
    TEST_ASSERT_EQUAL(1, number->valueint);
    TEST_ASSERT_EQUAL_DOUBLE(1.5, number->valuedouble);

    cJSON_SetNumberValue(number, -1.5);
    TEST_ASSERT_EQUAL(-1, number->valueint);
    TEST_ASSERT_EQUAL_DOUBLE(-1.5, number->valuedouble);

    cJSON_SetNumberValue(number, 1 + (double)INT_MAX);
    TEST_ASSERT_EQUAL(INT_MAX, number->valueint);
    TEST_ASSERT_EQUAL_DOUBLE(1 + (double)INT_MAX, number->valuedouble);

    cJSON_SetNumberValue(number, -1 + (double)INT_MIN);
    TEST_ASSERT_EQUAL(INT_MIN, number->valueint);
    TEST_ASSERT_EQUAL_DOUBLE(-1 + (double)INT_MIN, number->valuedouble);
}